

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::Tracer_testPropagation_Test::~Tracer_testPropagation_Test
          (Tracer_testPropagation_Test *this)

{
  Tracer_testPropagation_Test *this_local;
  
  ~Tracer_testPropagation_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Tracer, testPropagation)
{
    const auto handle = testutils::TracerUtil::installGlobalTracer();
    const auto tracer =
        std::static_pointer_cast<Tracer>(opentracing::Tracer::Global());
    const std::unique_ptr<Span> span(static_cast<Span*>(
        tracer->StartSpanWithOptions("test-inject", {}).release()));
    span->SetBaggageItem("test-baggage-item-key", "test baggage item value");

    // Binary
    {
        std::stringstream ss;
        ASSERT_TRUE(static_cast<bool>(tracer->Inject(span->context(), ss)));
        auto result = tracer->Extract(ss);
        ASSERT_TRUE(static_cast<bool>(result));
        std::unique_ptr<const SpanContext> extractedCtx(
            static_cast<SpanContext*>(result->release()));
        ASSERT_TRUE(static_cast<bool>(extractedCtx));
        ASSERT_EQ(span->context(), *extractedCtx);
        FakeSpanContext fakeCtx;
        ss.clear();
        ss.str("");
        ASSERT_FALSE(static_cast<bool>(tracer->Inject(fakeCtx, ss)));
    }

    // Text map
    {
        StrMap textMap;
        WriterMock<opentracing::TextMapWriter> textWriter(textMap);
        ASSERT_TRUE(
            static_cast<bool>(tracer->Inject(span->context(), textWriter)));
        ASSERT_EQ(2, textMap.size());
        std::ostringstream oss;
        oss << span->context();
        ASSERT_EQ(oss.str(), textMap.at(kTraceContextHeaderName));
        ASSERT_EQ("test baggage item value",
                  textMap.at(std::string(kTraceBaggageHeaderPrefix) +
                             "test-baggage-item-key"));
        ReaderMock<opentracing::TextMapReader> textReader(textMap);
        auto result = tracer->Extract(textReader);
        ASSERT_TRUE(static_cast<bool>(result));
        std::unique_ptr<const SpanContext> extractedCtx(
            static_cast<SpanContext*>(result->release()));
        ASSERT_TRUE(static_cast<bool>(extractedCtx));
        ASSERT_EQ(span->context(), *extractedCtx);
    }

    // HTTP map
    {
        StrMap headerMap;
        WriterMock<opentracing::HTTPHeadersWriter> headerWriter(headerMap);
        ASSERT_TRUE(
            static_cast<bool>(tracer->Inject(span->context(), headerWriter)));
        ASSERT_EQ(2, headerMap.size());
        std::ostringstream oss;
        oss << span->context();
        ASSERT_EQ(oss.str(), headerMap.at(kTraceContextHeaderName));
        ASSERT_EQ("test%20baggage%20item%20value",
                  headerMap.at(std::string(kTraceBaggageHeaderPrefix) +
                               "test-baggage-item-key"));
        ReaderMock<opentracing::HTTPHeadersReader> headerReader(headerMap);
        auto result = tracer->Extract(headerReader);
        ASSERT_TRUE(static_cast<bool>(result));
        std::unique_ptr<const SpanContext> extractedCtx(
            static_cast<SpanContext*>(result->release()));
        ASSERT_TRUE(static_cast<bool>(extractedCtx));
        ASSERT_EQ(span->context(), *extractedCtx);

        // Test debug header.
        headerMap.clear();
        headerMap[kJaegerDebugHeader] = "yes";
        tracer->Inject(span->context(), headerWriter);
        result = tracer->Extract(headerReader);
        ASSERT_TRUE(static_cast<bool>(result));
        extractedCtx.reset(static_cast<SpanContext*>(result->release()));
        ASSERT_TRUE(static_cast<bool>(extractedCtx));
        ASSERT_NE(span->context(), *extractedCtx);
        SpanContext ctx(
            span->context().traceID(),
            span->context().spanID(),
            span->context().parentID(),
            span->context().flags() |
                static_cast<unsigned char>(SpanContext::Flag::kDebug),
            span->context().baggage(),
            "yes");
        ASSERT_EQ(ctx, *extractedCtx);

        // Test bad trace context.
        headerMap.clear();
        headerMap[kTraceContextHeaderName] = "12345678";
        result = tracer->Extract(headerReader);
        ASSERT_TRUE(static_cast<bool>(result));
        extractedCtx.reset(static_cast<SpanContext*>(result->release()));
        ASSERT_EQ(nullptr, extractedCtx.get());

        // Test empty map.
        headerMap.clear();
        result = tracer->Extract(headerReader);
        ASSERT_TRUE(static_cast<bool>(result));
        extractedCtx.reset(static_cast<SpanContext*>(result->release()));
        ASSERT_EQ(nullptr, extractedCtx.get());

        // Test alternative baggage format.
        headerMap.clear();
        ctx = SpanContext(span->context().traceID(),
                          span->context().spanID(),
                          span->context().parentID(),
                          span->context().flags(),
                          { { "a", "x" }, { "b", "y" }, { "c", "z" } });
        tracer->Inject(ctx, headerWriter);
        for (auto itr = std::begin(headerMap); itr != std::end(headerMap);) {
            if (itr->first.substr(0, std::strlen(kTraceBaggageHeaderPrefix)) ==
                kTraceBaggageHeaderPrefix) {
                itr = headerMap.erase(itr);
            }
            else {
                ++itr;
            }
        }
        headerMap[kJaegerBaggageHeader] = "a=x,b=y,c=z";
        result = tracer->Extract(headerReader);
        ASSERT_TRUE(static_cast<bool>(result));
        extractedCtx.reset(static_cast<SpanContext*>(result->release()));
        ASSERT_TRUE(static_cast<bool>(extractedCtx));
        ASSERT_EQ(3, extractedCtx->baggage().size());
        ASSERT_EQ(ctx, *extractedCtx);
    }
    tracer->Close();
}